

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XercesNodeTest::XercesNodeTest
          (XercesNodeTest *this,XMLCh *prefix,uint uriId,MemoryManager *manager)

{
  QName *this_00;
  
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XercesNodeTest_00407988;
  this->fType = 4;
  this_00 = (QName *)XMemory::operator_new(0x48,manager);
  QName::QName(this_00,manager);
  this->fName = this_00;
  this_00->fURIId = uriId;
  QName::setPrefix(this_00,prefix);
  return;
}

Assistant:

XercesNodeTest::XercesNodeTest(const XMLCh* const prefix,
                               const unsigned int uriId,
                               MemoryManager* const manager)
    : fType(NodeType_NAMESPACE)
    , fName(new (manager) QName(manager))
{
    fName->setURI(uriId);
    fName->setPrefix(prefix);
}